

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench_sqlite3.cc
# Opt level: O2

Slice leveldb::anon_unknown_3::TrimSpace(Slice s)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  ulong n;
  int iVar5;
  ulong in_RSI;
  char *in_RDI;
  long lVar6;
  size_t n_00;
  Slice SVar7;
  Slice local_40;
  
  lVar6 = 0;
  local_40.data_ = in_RDI;
  local_40.size_ = in_RSI;
  for (n = 0; n < local_40.size_; n = n + 1) {
    cVar2 = Slice::operator[](&local_40,n);
    iVar3 = isspace((int)cVar2);
    if (iVar3 == 0) break;
    lVar6 = lVar6 + 0x100000000;
  }
  iVar3 = (int)local_40.size_;
  n_00 = (size_t)iVar3;
  uVar1 = local_40.size_;
  if ((int)n < iVar3) {
    uVar1 = n;
  }
  iVar3 = iVar3 + 1;
  do {
    iVar5 = (int)uVar1;
    if ((long)n_00 <= lVar6 >> 0x20) break;
    n_00 = n_00 - 1;
    cVar2 = Slice::operator[](&local_40,n_00);
    iVar4 = isspace((int)cVar2);
    iVar3 = iVar3 + -1;
    iVar5 = iVar3;
  } while (iVar4 != 0);
  SVar7.data_ = local_40.data_ + n;
  SVar7.size_ = (size_t)(iVar5 - (int)n);
  return SVar7;
}

Assistant:

static Slice TrimSpace(Slice s) {
  int start = 0;
  while (start < s.size() && isspace(s[start])) {
    start++;
  }
  int limit = s.size();
  while (limit > start && isspace(s[limit - 1])) {
    limit--;
  }
  return Slice(s.data() + start, limit - start);
}